

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpAgent.h
# Opt level: O0

int __thiscall FileBodyHandler::handleSocket(FileBodyHandler *this,Socket *sock,int len)

{
  uint uVar1;
  int iStack_10034;
  int attempt_read;
  int read;
  int total_read;
  char buf [65536];
  int local_1c;
  int len_local;
  Socket *sock_local;
  FileBodyHandler *this_local;
  
  attempt_read = 0;
  local_1c = len;
  while( true ) {
    if (local_1c == 0) {
      return attempt_read;
    }
    iStack_10034 = 0x10000;
    if (local_1c < 0x10000) {
      iStack_10034 = local_1c;
    }
    uVar1 = (**(code **)(*(long *)sock + 0x18))(sock,&read,iStack_10034);
    if ((int)uVar1 < 0) break;
    (**(code **)(*(long *)this->mFile + 0x18))(this->mFile,&read,uVar1);
    local_1c = local_1c - uVar1;
    attempt_read = uVar1 + attempt_read;
  }
  printf("ERROR READING = %d\n",(ulong)uVar1);
  return attempt_read;
}

Assistant:

int handleSocket( JetHead::Socket &sock, int len )
	{
		char buf[TEST_BUFFER_SIZE];
		int total_read = 0;
		
		while (len)
		{
			int read = 0;
			int attempt_read = TEST_BUFFER_SIZE;

			if (len < TEST_BUFFER_SIZE)
				attempt_read = len;

			read = sock.read(buf, attempt_read);

			if (read < 0)
			{
				printf("ERROR READING = %d\n", read);
				break;
			}

			mFile.write( buf, read );

			len -= read;
			total_read += read;
		}
		
		return total_read;
	}